

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCube>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomCube *cube,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_node_base *__x;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  mapped_type *this;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  string *psVar7;
  Property *prop;
  allocator local_289;
  string *local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_280;
  Property *local_278;
  _Rb_tree_node_base *local_270;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_268;
  string local_260;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream ss_e;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&cube->super_GPrim,warn,err,options->strict_allowedToken_check);
  if (bVar2) {
    p_Var5 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_270 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_268 = &cube->size;
    local_280 = &(cube->super_GPrim).props;
    local_288 = err;
    while( true ) {
      bVar2 = p_Var5 == local_270;
      if (bVar2) break;
      __x = p_Var5 + 1;
      ::std::__cxx11::string::string((string *)&local_1c8,(string *)__x);
      prop = (Property *)(p_Var5 + 2);
      psVar7 = (string *)&ss_e;
      ::std::__cxx11::string::string((string *)psVar7,"size",(allocator *)&local_260);
      anon_unknown_0::ParseTypedAttribute<double>(&ret,&table,&local_1c8,prop,psVar7,local_268);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar6 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar1 = false;
        iVar6 = 3;
      }
      else {
        bVar1 = true;
        if (ret.code != Unmatched) {
          local_278 = prop;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrim");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xe0b);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    ((string *)&local_1e8,"Parsing attribute `{}` failed. Error: {}",&local_289);
          fmt::format<char[5],std::__cxx11::string>
                    (&local_260,(fmt *)&local_1e8,(string *)0x4a8fb9,(char (*) [5])&ret.err,psVar7);
          poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&local_260);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_288;
          if (local_288 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_260,&local_1e8,psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_260);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
          iVar6 = 1;
          prop = local_278;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar1) {
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)__x);
        if (sVar4 == 0) {
          this = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](local_280,(key_type *)__x);
          Property::operator=(this,prop);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
        }
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)__x);
        if (sVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrim");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xe0d);
          ::std::operator<<(poVar3," ");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x)
          ;
          poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_288;
          if (local_288 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,&local_260,psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_001c11f4;
        }
      }
      else if ((iVar6 != 3) && (iVar6 != 0)) break;
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
    }
  }
  else {
LAB_001c11f4:
    bVar2 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar2;
}

Assistant:

bool ReconstructPrim<GeomCube>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCube *cube,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  //
  // pxrUSD says... "If you author size you must also author extent."
  //
  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, cube, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "size", GeomCube, cube->size)
    ADD_PROPERTY(table, prop, GeomCube, cube->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}